

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepperHHT.cpp
# Opt level: O1

ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode> * __thiscall
chrono::my_enum_mappers::HHT_Mode_mapper::operator()
          (ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode> *__return_storage_ptr__,
          HHT_Mode_mapper *this,HHT_Mode *mval)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  peVar1 = (this->super_ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode>).enummap.
           super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  this_00 = (this->super_ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode>).enummap.
            super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  (__return_storage_ptr__->super_ChEnumMapperBase)._vptr_ChEnumMapperBase =
       (_func_int **)&PTR_GetValueAsInt_00b6c098;
  __return_storage_ptr__->value_ptr = (HHT_Mode *)0x0;
  (__return_storage_ptr__->enummap).
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar1;
  (__return_storage_ptr__->enummap).
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = this_00;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  __return_storage_ptr__->value_ptr = mval;
  return __return_storage_ptr__;
}

Assistant:

void ChTimestepperHHT::ArchiveOUT(ChArchiveOut& archive) {
    // version number
    archive.VersionWrite<ChTimestepperHHT>();
    // serialize parent class:
    ChTimestepperIIorder::ArchiveOUT(archive);
    ChImplicitIterativeTimestepper::ArchiveOUT(archive);
    // serialize all member data:
    archive << CHNVP(alpha);
    archive << CHNVP(beta);
    archive << CHNVP(gamma);
    archive << CHNVP(scaling);
    my_enum_mappers::HHT_Mode_mapper modemapper;
    archive << CHNVP(modemapper(mode), "mode");
}